

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerThreadPool.cpp
# Opt level: O0

LayerThreadPool * PyreNet::LayerThreadPool::getInstance(void)

{
  LayerThreadPool *pLVar1;
  undefined1 local_18 [8];
  unique_lock<std::mutex> lg;
  
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)local_18,(mutex_type *)instanceMutex);
  if (instance == (LayerThreadPool *)0x0) {
    pLVar1 = (LayerThreadPool *)operator_new(0x118);
    LayerThreadPool(pLVar1);
    instance = pLVar1;
  }
  pLVar1 = instance;
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_18);
  return pLVar1;
}

Assistant:

PyreNet::LayerThreadPool *LayerThreadPool::getInstance() {
        std::unique_lock<std::mutex> lg(instanceMutex);
        if (!instance)
            instance = new LayerThreadPool;
        return instance;
    }